

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::optimizeStageIO(TIntermediate *this,TInfoSink *param_1,TIntermediate *unit)

{
  value_type pTVar1;
  anon_class_16_2_ce0f2fd8 __f;
  bool bVar2;
  EShLanguage EVar3;
  char *__s;
  reference ppTVar4;
  TIntermNode *pTVar5;
  iterator __first;
  iterator __last;
  undefined1 local_358 [8];
  TIOTraverser unitAllTraverser;
  TIOTraverser allTraverser;
  TIntermSequence unitAllInputs;
  TIntermSequence allOutputs;
  TIntermNode *destination;
  TString local_148;
  undefined1 local_120 [8];
  TIOTraverser unitTraverser;
  TIntermSequence unitLiveInputs;
  TIntermediate *unit_local;
  TInfoSink *param_2_local;
  TIntermediate *this_local;
  
  EVar3 = getStage(this);
  if (((int)EVar3 < 5) && (EVar3 = getStage(unit), (int)EVar3 < 5)) {
    TVector<TIntermNode_*>::TVector((TVector<TIntermNode_*> *)&unitTraverser.storage);
    optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::TIOTraverser::TIOTraverser(glslang::
    TIntermediate&,bool,glslang::TVector<TIntermNode*>&,glslang::TStorageQualifier_
              (local_120,unit,false,(TIntermSequence *)&unitTraverser.storage,EvqVaryingIn);
    getEntryPointMangledName_abi_cxx11_(unit);
    __s = (char *)std::__cxx11::string::c_str();
    pool_allocator<char>::pool_allocator((pool_allocator<char> *)&destination);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_148
               ,__s,(pool_allocator<char> *)&destination);
    TLiveTraverser::pushFunction((TLiveTraverser *)local_120,&local_148);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_148);
    while (bVar2 = std::__cxx11::
                   list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::
                   empty((list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                          *)&unitTraverser.super_TLiveTraverser.super_TIntermTraverser.path.
                             super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      ppTVar4 = std::__cxx11::
                list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::
                back((list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                      *)&unitTraverser.super_TLiveTraverser.super_TIntermTraverser.path.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      pTVar1 = *ppTVar4;
      std::__cxx11::list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
      ::pop_back((list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_> *)
                 &unitTraverser.super_TLiveTraverser.super_TIntermTraverser.path.
                  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[2])
                (pTVar1,local_120);
    }
    TVector<TIntermNode_*>::TVector
              ((TVector<TIntermNode_*> *)
               &unitAllInputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    TVector<TIntermNode_*>::TVector((TVector<TIntermNode_*> *)&allTraverser.storage);
    optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::TIOTraverser::TIOTraverser(glslang::
    TIntermediate&,bool,glslang::TVector<TIntermNode*>&,glslang::TStorageQualifier_
              (&unitAllTraverser.storage,this,true,
               (TIntermSequence *)
               &unitAllInputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,EvqVaryingOut);
    pTVar5 = getTreeRoot(this);
    (*pTVar5->_vptr_TIntermNode[2])(pTVar5,&unitAllTraverser.storage);
    optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::TIOTraverser::TIOTraverser(glslang::
    TIntermediate&,bool,glslang::TVector<TIntermNode*>&,glslang::TStorageQualifier_
              (local_358,unit,true,(TIntermSequence *)&allTraverser.storage,EvqVaryingIn);
    pTVar5 = getTreeRoot(unit);
    (*pTVar5->_vptr_TIntermNode[2])(pTVar5,local_358);
    __first = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         &unitAllInputs.
                          super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __last = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                       ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                        &unitAllInputs.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    __f.unitAllInputs = (TIntermSequence *)&allTraverser.storage;
    __f.unitLiveInputs = (TIntermSequence *)&unitTraverser.storage;
    std::
    for_each<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
              ((__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                )__first._M_current,
               (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                )__last._M_current,__f);
    optimizeStageIO::TIOTraverser::~TIOTraverser((TIOTraverser *)local_358);
    optimizeStageIO::TIOTraverser::~TIOTraverser((TIOTraverser *)&unitAllTraverser.storage);
    TVector<TIntermNode_*>::~TVector((TVector<TIntermNode_*> *)&allTraverser.storage);
    TVector<TIntermNode_*>::~TVector
              ((TVector<TIntermNode_*> *)
               &unitAllInputs.super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    optimizeStageIO::TIOTraverser::~TIOTraverser((TIOTraverser *)local_120);
    TVector<TIntermNode_*>::~TVector((TVector<TIntermNode_*> *)&unitTraverser.storage);
  }
  return;
}

Assistant:

void TIntermediate::optimizeStageIO(TInfoSink&, TIntermediate& unit)
{
    // don't do any input/output demotion on compute, raytracing, or task/mesh stages
    // TODO: support task/mesh
    if (getStage() > EShLangFragment || unit.getStage() > EShLangFragment) {
        return;
    }

    class TIOTraverser : public TLiveTraverser {
    public:
        TIOTraverser(TIntermediate& i, bool all, TIntermSequence& sequence, TStorageQualifier storage)
            : TLiveTraverser(i, all, true, false, false), sequence(sequence), storage(storage)
        {
        }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            if (symbol->getQualifier().storage == storage) {
                sequence.push_back(symbol);
            }
        }

    private:
        TIntermSequence& sequence;
        TStorageQualifier storage;
    };

    // live symbols only
    TIntermSequence unitLiveInputs;

    TIOTraverser unitTraverser(unit, false, unitLiveInputs, EvqVaryingIn);
    unitTraverser.pushFunction(unit.getEntryPointMangledName().c_str());
    while (! unitTraverser.destinations.empty()) {
        TIntermNode* destination = unitTraverser.destinations.back();
        unitTraverser.destinations.pop_back();
        destination->traverse(&unitTraverser);
    }

    TIntermSequence allOutputs;
    TIntermSequence unitAllInputs;

    TIOTraverser allTraverser(*this, true, allOutputs, EvqVaryingOut);
    getTreeRoot()->traverse(&allTraverser);

    TIOTraverser unitAllTraverser(unit, true, unitAllInputs, EvqVaryingIn);
    unit.getTreeRoot()->traverse(&unitAllTraverser);

    // find outputs not consumed by the next stage
    std::for_each(allOutputs.begin(), allOutputs.end(), [&unitLiveInputs, &unitAllInputs](TIntermNode* output) {
        // don't do anything to builtins
        if (output->getAsSymbolNode()->getAccessName().compare(0, 3, "gl_") == 0)
            return;

        // don't demote block outputs (for now)
        if (output->getAsSymbolNode()->getBasicType() == EbtBlock)
            return;

        // check if the (loose) output has a matching loose input
        auto isMatchingInput = [output](TIntermNode* input) {
            return output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName();
        };

        // check if the (loose) output has a matching block member input
        auto isMatchingInputBlockMember = [output](TIntermNode* input) {
            // ignore loose inputs
            if (input->getAsSymbolNode()->getBasicType() != EbtBlock)
                return false;

            // don't demote loose outputs with matching input block members
            auto isMatchingBlockMember = [output](TTypeLoc type) {
                return type.type->getFieldName() == output->getAsSymbolNode()->getName();
            };
            const TTypeList* members = input->getAsSymbolNode()->getType().getStruct();
            return std::any_of(members->begin(), members->end(), isMatchingBlockMember);
        };

        // determine if the input/output pair should be demoted
        // do the faster (and more likely) loose-loose check first
        if (std::none_of(unitLiveInputs.begin(), unitLiveInputs.end(), isMatchingInput) && 
            std::none_of(unitAllInputs.begin(), unitAllInputs.end(), isMatchingInputBlockMember)) {
            // demote any input matching the output
            auto demoteMatchingInputs = [output](TIntermNode* input) {
                if (output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName()) {
                    // demote input to a plain variable
                    TIntermSymbol* symbol = input->getAsSymbolNode();
                    symbol->getQualifier().storage = EvqGlobal;
                    symbol->getQualifier().clearInterstage();
                    symbol->getQualifier().clearLayout();
                }
            };

            // demote all matching outputs to a plain variable
            TIntermSymbol* symbol = output->getAsSymbolNode();
            symbol->getQualifier().storage = EvqGlobal;
            symbol->getQualifier().clearInterstage();
            symbol->getQualifier().clearLayout();
            std::for_each(unitAllInputs.begin(), unitAllInputs.end(), demoteMatchingInputs);
        }
    });
}